

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_reporter.h
# Opt level: O0

void __thiscall bandit::detail::spec_reporter::it_starting(spec_reporter *this,char *desc)

{
  ostream *poVar1;
  _List_node_base *local_18;
  char *desc_local;
  spec_reporter *this_local;
  
  local_18 = (_List_node_base *)desc;
  desc_local = (char *)this;
  progress_reporter::it_starting(&this->super_progress_reporter,desc);
  poVar1 = this->stm_;
  indent_abi_cxx11_((spec_reporter *)&stack0xffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,(string *)&stack0xffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,"- it ");
  poVar1 = std::operator<<(poVar1,(char *)local_18);
  std::operator<<(poVar1," ... ");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_starting(const char* desc)
    {
      progress_reporter::it_starting(desc);
      stm_ << indent() << "- it " << desc << " ... ";
      stm_.flush();
    }